

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z_queued.c
# Opt level: O2

void libpd_queued_receive_midi_messages(void)

{
  void *pvVar1;
  int len;
  code *pcVar2;
  char *pcVar3;
  char *pcVar4;
  
  pvVar1 = libpd_mainimp.i_queued;
  len = rb_available_to_read(*(ring_buffer **)((long)libpd_mainimp.i_queued + 0x78));
  if (len == 0) {
    return;
  }
  rb_read_from_buffer(*(ring_buffer **)((long)pvVar1 + 0x78),(char *)((long)pvVar1 + 0x80),len);
  pcVar4 = (char *)((long)pvVar1 + 0x80);
switchD_001994c8_default:
  pcVar3 = pcVar4;
  if ((char *)((long)pvVar1 + (long)len + 0x80) <= pcVar3) {
    return;
  }
  pcVar4 = pcVar3 + 0x10;
  switch(*(undefined4 *)pcVar3) {
  case 0:
    pcVar2 = *(code **)((long)libpd_mainimp.i_queued + 0x30);
    goto LAB_00199504;
  case 1:
    pcVar2 = *(code **)((long)libpd_mainimp.i_queued + 0x38);
    goto LAB_00199504;
  case 2:
    pcVar2 = *(code **)((long)libpd_mainimp.i_queued + 0x40);
    break;
  case 3:
    pcVar2 = *(code **)((long)libpd_mainimp.i_queued + 0x48);
    break;
  case 4:
    pcVar2 = *(code **)((long)libpd_mainimp.i_queued + 0x50);
    break;
  case 5:
    pcVar2 = *(code **)((long)libpd_mainimp.i_queued + 0x58);
LAB_00199504:
    if (pcVar2 != (code *)0x0) {
      (*pcVar2)(*(undefined4 *)(pcVar3 + 4),*(undefined4 *)(pcVar3 + 8),
                *(undefined4 *)(pcVar3 + 0xc));
    }
    goto switchD_001994c8_default;
  case 6:
    pcVar2 = *(code **)((long)libpd_mainimp.i_queued + 0x60);
    break;
  default:
    goto switchD_001994c8_default;
  }
  if (pcVar2 != (code *)0x0) {
    (*pcVar2)(*(undefined4 *)(pcVar3 + 4),*(undefined4 *)(pcVar3 + 8));
  }
  goto switchD_001994c8_default;
}

Assistant:

void libpd_queued_receive_midi_messages() {
  queued_stuff *queued = QUEUEDSTUFF;
  size_t available = rb_available_to_read(queued->midi_receive_buffer);
  if (!available) return;
  rb_read_from_buffer(queued->midi_receive_buffer, queued->temp_buffer, (int)available);
  char *end = queued->temp_buffer + available;
  char *buffer = queued->temp_buffer;
  while (buffer < end) {
    midi_params *p = (midi_params *)buffer;
    buffer += S_MIDI_PARAMS;
    switch (p->type) {
      case LIBPD_NOTEON: {
        receive_noteon(p, &buffer);
        break;
      }
      case LIBPD_CONTROLCHANGE: {
        receive_controlchange(p, &buffer);
        break;
      }
      case LIBPD_PROGRAMCHANGE: {
        receive_programchange(p, &buffer);
        break;
      }
      case LIBPD_PITCHBEND: {
        receive_pitchbend(p, &buffer);
        break;
      }
      case LIBPD_AFTERTOUCH: {
        receive_aftertouch(p, &buffer);
        break;
      }
      case LIBPD_POLYAFTERTOUCH: {
        receive_polyaftertouch(p, &buffer);
        break;
      }
      case LIBPD_MIDIBYTE: {
        receive_midibyte(p, &buffer);
        break;
      }
      default:
        break;
    }
  }
}